

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropout.cpp
# Opt level: O2

int test_dropout(Mat *a,float scale)

{
  int iVar1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  Option opt;
  ParamDict pd;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_958;
  Option local_940;
  ParamDict local_918;
  
  ncnn::ParamDict::ParamDict(&local_918);
  ncnn::ParamDict::set(&local_918,0,scale);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&local_958,0,(allocator_type *)&local_940);
  ncnn::Option::Option(&local_940);
  local_940.num_threads = 1;
  local_940.use_int8_inference = false;
  local_940.use_vulkan_compute = true;
  iVar1 = test_layer<ncnn::Dropout>
                    ("Dropout",&local_918,&local_958,&local_940,a,0.001,
                     (_func_void_Dropout_ptr *)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"test_dropout failed a.dims=%d a=(%d %d %d) scale=%f\n",(double)scale,
            (ulong)(uint)a->dims,(ulong)(uint)a->w,(ulong)(uint)a->h,(ulong)(uint)a->c);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_958);
  ncnn::ParamDict::~ParamDict(&local_918);
  return iVar1;
}

Assistant:

static int test_dropout(const ncnn::Mat& a, float scale)
{
    ncnn::ParamDict pd;
    pd.set(0, scale);

    std::vector<ncnn::Mat> weights(0);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Dropout>("Dropout", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_dropout failed a.dims=%d a=(%d %d %d) scale=%f\n", a.dims, a.w, a.h, a.c, scale);
    }

    return ret;
}